

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

int8_t hex_to_char(char hex)

{
  byte bVar1;
  int8_t iVar2;
  uint8_t c;
  
  bVar1 = hex - 0x30;
  if (9 < bVar1) {
    if (5 < (byte)(hex + 0xbfU)) {
      iVar2 = -1;
      if ((byte)(hex + 0x9fU) < 6) {
        iVar2 = hex + -0x57;
      }
      return iVar2;
    }
    bVar1 = hex - 0x37;
  }
  return bVar1;
}

Assistant:

static int8_t
hex_to_char(char hex) {
    uint8_t c = hex;

    if (c >= '0' && c <= '9') {
        c = c - 48;
    } else if (c >= 'A' && c <= 'F') {
        c = c - 55;  /* 65 - 10 */
    } else if (c >= 'a' && c <= 'f') {
        c = c - 87;  /* 97 - 10 */
    } else {
        return -1;
    }
    return c;
}